

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

int mbedtls_mpi_random(mbedtls_mpi *X,mbedtls_mpi_sint min,mbedtls_mpi *N,
                      _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  int iVar2;
  undefined1 local_50 [8];
  mbedtls_mpi Y;
  mbedtls_mpi_uint p [1];
  
  iVar2 = -4;
  if (-1 < min) {
    local_50 = (undefined1  [8])&Y.s;
    Y.p._0_4_ = 0x10001;
    Y._8_8_ = min;
    iVar1 = mbedtls_mpi_cmp_mpi(N,(mbedtls_mpi *)local_50);
    if (0 < iVar1) {
      iVar2 = mbedtls_mpi_resize_clear(X,(ulong)N->n);
      if (iVar2 == 0) {
        iVar2 = mbedtls_mpi_core_random(X->p,min,N->p,(ulong)X->n,f_rng,p_rng);
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_mpi_random(mbedtls_mpi *X,
                       mbedtls_mpi_sint min,
                       const mbedtls_mpi *N,
                       int (*f_rng)(void *, unsigned char *, size_t),
                       void *p_rng)
{
    if (min < 0) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }
    if (mbedtls_mpi_cmp_int(N, min) <= 0) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    /* Ensure that target MPI has exactly the same number of limbs
     * as the upper bound, even if the upper bound has leading zeros.
     * This is necessary for mbedtls_mpi_core_random. */
    int ret = mbedtls_mpi_resize_clear(X, N->n);
    if (ret != 0) {
        return ret;
    }

    return mbedtls_mpi_core_random(X->p, min, N->p, X->n, f_rng, p_rng);
}